

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_input(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  undefined1 uVar1;
  ptls_iovec_t *ppVar2;
  ptls_buffer_t *ppVar3;
  ptls_buffer_t *ppVar4;
  ushort uVar5;
  int iVar6;
  undefined1 *puVar7;
  ptls_iovec_t *ppVar8;
  uint32_t uVar9;
  uint8_t *puVar10;
  uint uVar11;
  ptls_handshake_properties_t *inlen_00;
  undefined1 *puVar12;
  anon_struct_64_2_7cec4369_for_recvbuf *buf;
  ulong delta;
  uint8_t uVar13;
  uint uVar14;
  ulong __n;
  undefined1 *puVar15;
  size_t decrypted_length;
  ptls_message_emitter_t local_88;
  anon_struct_64_2_7cec4369_for_recvbuf *local_60;
  undefined1 *local_58;
  ptls_handshake_properties_t *local_50;
  ptls_handshake_properties_t *local_48;
  ptls_handshake_properties_t *local_40;
  ptls_handshake_properties_t *local_38;
  
  ppVar3 = local_88.buf;
  if ((tls->field_0x160 & 0x20) == 0) {
    buf = &tls->recvbuf;
    puVar10 = (tls->recvbuf).rec.base;
    ppVar2 = (ptls_iovec_t *)*inlen;
    if (ppVar2 < (ptls_iovec_t *)0x5 || puVar10 != (uint8_t *)0x0) {
      local_88.buf = (ptls_buffer_t *)0x0;
      local_88.record_header_length = 0;
      if (puVar10 == (uint8_t *)0x0) goto LAB_00110427;
LAB_00110478:
      ppVar3 = local_88.buf;
      puVar12 = (undefined1 *)((long)&ppVar2->base + (long)input);
      puVar15 = (undefined1 *)(tls->recvbuf).rec.off;
      while (puVar15 < (undefined1 *)0x5) {
        if ((undefined1 *)input == puVar12) {
          return 0x202;
        }
        uVar1 = *input;
        input = (void *)((long)input + 1);
        puVar10 = (tls->recvbuf).rec.base;
        (tls->recvbuf).rec.off = (size_t)(puVar15 + 1);
        puVar15[(long)puVar10] = uVar1;
        puVar15 = (undefined1 *)(tls->recvbuf).rec.off;
      }
      puVar10 = (buf->rec).base;
      uVar13 = *puVar10;
      local_88.buf = (ptls_buffer_t *)CONCAT71(local_88.buf._1_7_,uVar13);
      ppVar4 = local_88.buf;
      local_88.buf._4_4_ = SUB84(ppVar3,4);
      local_88.buf._0_2_ = SUB82(ppVar4,0);
      local_88.buf._0_4_ =
           CONCAT22(*(ushort *)(puVar10 + 1) << 8 | *(ushort *)(puVar10 + 1) >> 8,local_88.buf._0_2_
                   );
      uVar5 = *(ushort *)(puVar10 + 3) << 8 | *(ushort *)(puVar10 + 3) >> 8;
      inlen_00 = (ptls_handshake_properties_t *)(ulong)uVar5;
      if ((ushort)((uVar13 == '\x17' | 0x40) << 8) < uVar5) {
        return 0x32;
      }
      puVar7 = (undefined1 *)((long)&inlen_00->field_0 + 5);
      delta = (long)puVar7 - (long)puVar15;
      local_88.enc = (st_ptls_traffic_protection_t *)inlen_00;
      if (delta != 0) {
        local_88.commit_message = (_func_int_st_ptls_message_emitter_t_ptr *)emitter;
        local_58 = puVar7;
        local_50 = inlen_00;
        local_48 = (ptls_handshake_properties_t *)inlen;
        local_40 = properties;
        iVar6 = ptls_buffer_reserve(&buf->rec,delta);
        if (iVar6 != 0) {
          return iVar6;
        }
        __n = (long)puVar12 - (long)input;
        if (delta < (ulong)((long)puVar12 - (long)input)) {
          __n = delta;
        }
        puVar15 = (undefined1 *)(tls->recvbuf).rec.off;
        puVar7 = local_58;
        inlen_00 = local_50;
        emitter = (ptls_message_emitter_t *)local_88.commit_message;
        inlen = (size_t *)local_48;
        properties = local_40;
        local_60 = buf;
        if (__n != 0) {
          memcpy(puVar15 + (long)(tls->recvbuf).rec.base,input,__n);
          input = (void *)((long)input + __n);
          puVar15 = (undefined1 *)(__n + (tls->recvbuf).rec.off);
          (tls->recvbuf).rec.off = (size_t)puVar15;
          puVar7 = local_58;
          inlen_00 = local_50;
          emitter = (ptls_message_emitter_t *)local_88.commit_message;
          inlen = (size_t *)local_48;
          properties = local_40;
          buf = local_60;
        }
      }
      if (puVar15 != puVar7) {
        (((ptls_handshake_properties_t *)inlen)->field_0).client.negotiated_protocols.list =
             (ptls_iovec_t *)
             ((long)input +
             ((long)(((ptls_handshake_properties_t *)inlen)->field_0).client.negotiated_protocols.
                    list - (long)puVar12));
        return 0x202;
      }
      puVar10 = (buf->rec).base + 5;
      ppVar8 = (ptls_iovec_t *)
               ((long)input +
               ((long)(((ptls_handshake_properties_t *)inlen)->field_0).client.negotiated_protocols.
                      list - (long)puVar12));
    }
    else {
      uVar13 = *input;
      local_88.buf = (ptls_buffer_t *)CONCAT71(local_88.buf._1_7_,uVar13);
      ppVar4 = local_88.buf;
      local_88.buf._4_4_ = SUB84(ppVar3,4);
      local_88.buf._0_2_ = SUB82(ppVar4,0);
      local_88.buf._0_4_ =
           CONCAT22(*(ushort *)((long)input + 1) << 8 | *(ushort *)((long)input + 1) >> 8,
                    local_88.buf._0_2_);
      uVar5 = *(ushort *)((long)input + 3) << 8 | *(ushort *)((long)input + 3) >> 8;
      inlen_00 = (ptls_handshake_properties_t *)(ulong)uVar5;
      if ((ushort)((uVar13 == '\x17' | 0x40) << 8) < uVar5) {
        return 0x32;
      }
      ppVar8 = (ptls_iovec_t *)((long)&inlen_00->field_0 + 5);
      if (ppVar2 < ppVar8) {
LAB_00110427:
        local_88.record_header_length = 0;
        local_88.enc = (st_ptls_traffic_protection_t *)0x0;
        local_88.buf = (ptls_buffer_t *)0x0;
        (tls->recvbuf).rec.base = "";
        (tls->recvbuf).rec.capacity = 0;
        (tls->recvbuf).rec.off = 0;
        (tls->recvbuf).rec.is_allocated = 0;
        local_88.commit_message = (_func_int_st_ptls_message_emitter_t_ptr *)emitter;
        iVar6 = ptls_buffer_reserve(&buf->rec,5);
        emitter = (ptls_message_emitter_t *)local_88.commit_message;
        if (iVar6 != 0) {
          return iVar6;
        }
        goto LAB_00110478;
      }
      puVar10 = (uint8_t *)((long)input + 5);
      local_88.enc = (st_ptls_traffic_protection_t *)inlen_00;
    }
    (((ptls_handshake_properties_t *)inlen)->field_0).client.negotiated_protocols.list = ppVar8;
    local_88.record_header_length = (size_t)puVar10;
    if (uVar13 == '\x14') {
      if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
        return 0x28;
      }
      if ((int)inlen_00 != 1) {
        return 0x2f;
      }
      uVar14 = 0x202;
      if (*puVar10 != '\x01') {
        return 0x2f;
      }
      goto LAB_0011077e;
    }
    if ((uVar13 == '\x15') || ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
      if ((uVar13 != '\x17') ||
         ((uVar13 = '\x17', (tls->field_0x160 & 1) == 0 ||
          (uVar9 = (tls->field_20).server.early_data_skipped_bytes, uVar9 == 0xffffffff))))
      goto LAB_0011071c;
    }
    else {
      if (uVar13 != '\x17') {
        return 0x28;
      }
      iVar6 = ptls_buffer_reserve(decryptbuf,(size_t)((long)&inlen_00->field_0 + 5));
      if (iVar6 != 0) {
        return iVar6;
      }
      inlen = (size_t *)inlen_00;
      iVar6 = aead_decrypt(&(tls->traffic_protection).dec,decryptbuf->base + decryptbuf->off,
                           (size_t *)&local_38,puVar10,(size_t)inlen_00);
      if (iVar6 == 0) {
        inlen_00 = local_38;
        do {
          if (inlen_00 == (ptls_handshake_properties_t *)0x0) {
            return 10;
          }
          inlen_00 = (ptls_handshake_properties_t *)((long)&inlen_00[-1].collected_extensions + 7);
          uVar13 = (decryptbuf->base + decryptbuf->off)[(long)inlen_00];
        } while (uVar13 == '\0');
        local_88.buf = (ptls_buffer_t *)CONCAT71(local_88.buf._1_7_,uVar13);
        local_88.enc = (st_ptls_traffic_protection_t *)inlen_00;
        local_88.record_header_length = (size_t)(decryptbuf->base + decryptbuf->off);
LAB_0011071c:
        if (((tls->recvbuf).mess.base == (uint8_t *)0x0) && (uVar13 != '\x16')) {
          if (uVar13 == '\x15') {
            uVar14 = 0x32;
            if (inlen_00 == (ptls_handshake_properties_t *)0x2) {
              uVar14 = *(byte *)(local_88.record_header_length + 1) | 0x100;
            }
          }
          else {
            uVar14 = 10;
            if (uVar13 == '\x17') {
              if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
                if ((tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) &&
                   (uVar14 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
                  decryptbuf->off = (long)&inlen_00->field_0 + decryptbuf->off;
                }
              }
              else {
                decryptbuf->off = (long)&inlen_00->field_0 + decryptbuf->off;
                uVar14 = 0;
              }
            }
          }
          goto LAB_0011077e;
        }
        goto LAB_00110750;
      }
      if ((tls->field_0x160 & 1) == 0) {
        return iVar6;
      }
      uVar9 = (tls->field_20).server.early_data_skipped_bytes;
      if (uVar9 == 0xffffffff) {
        return iVar6;
      }
    }
    uVar11 = (int)inlen_00 + uVar9;
    (tls->field_20).server.early_data_skipped_bytes = uVar11;
    uVar14 = 0x202;
    if (0x10000 < uVar11) {
      return 0x28;
    }
  }
  else {
LAB_00110750:
    uVar14 = handle_handshake_record
                       (tls,(_func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
                             *)emitter,&local_88,(st_ptls_record_t *)properties,
                        (ptls_handshake_properties_t *)inlen);
    if ((uVar14 == 0x202) && (uVar14 = 0x202, (tls->field_0x160 & 0x20) != 0)) {
      return 0x202;
    }
  }
LAB_0011077e:
  ptls_buffer__release_memory(&(tls->recvbuf).rec);
  (tls->recvbuf).rec.off = 0;
  *(undefined8 *)&(tls->recvbuf).rec.is_allocated = 0;
  (tls->recvbuf).rec.base = (uint8_t *)0x0;
  (tls->recvbuf).rec.capacity = 0;
  return uVar14;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    if (tls->in_handshake)
        goto resume_handshake;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        size_t decrypted_length;
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &decrypted_length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX)
                goto ServerSkipEarlyData;
            return ret;
        }
        rec.length = decrypted_length;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX) {
        goto ServerSkipEarlyData;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
resume_handshake:
        ret = handle_handshake_record(tls, handle_handshake_message, emitter, &rec, properties);
        if ((ret == PTLS_ERROR_IN_PROGRESS) && (tls->in_handshake))
            return ret;
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;

ServerSkipEarlyData:
    tls->server.early_data_skipped_bytes += (uint32_t)rec.length;
    if (tls->server.early_data_skipped_bytes > PTLS_MAX_EARLY_DATA_SKIP_SIZE)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    ret = PTLS_ERROR_IN_PROGRESS;
    goto NextRecord;
}